

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

void test_end(fitsfile *infits,FILE *out)

{
  int iVar1;
  undefined1 local_3c [4];
  long lStack_38;
  int hdutype;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  FILE *pFStack_18;
  int status;
  FILE *out_local;
  fitsfile *infits_local;
  
  headstart._4_4_ = 0;
  pFStack_18 = out;
  out_local = (FILE *)infits;
  ffmrhd(infits,1,local_3c,(long)&headstart + 4);
  if (headstart._4_4_ == 0) {
    wrtout(pFStack_18,"< End-of-File >");
    sprintf(errmes,"There are extraneous HDU(s) beyond the end of last HDU.");
    wrterr(pFStack_18,errmes,2);
    wrtout(pFStack_18," ");
  }
  else if (headstart._4_4_ == 0x6b) {
    headstart._4_4_ = 0;
    ffcmsg();
    iVar1 = ffghadll(out_local,&datastart,&dataend,&stack0xffffffffffffffc8,(long)&headstart + 4);
    if (iVar1 != 0) {
      wrtferr(pFStack_18,"",(int *)((long)&headstart + 4),1);
    }
    iVar1 = ffmbyt(out_local,lStack_38 + -1,0,(long)&headstart + 4);
    if (iVar1 == 0) {
      ffmbyt(out_local,lStack_38,0,(long)&headstart + 4);
      if (headstart._4_4_ == 0) {
        wrtout(pFStack_18,"< End-of-File >");
        sprintf(errmes,"File has extra byte(s) after last HDU at byte %ld.",lStack_38);
        wrterr(pFStack_18,errmes,2);
        wrtout(pFStack_18," ");
      }
    }
    else {
      sprintf(errmes,"Error trying to read last byte of the file at byte %ld.",lStack_38);
      wrterr(pFStack_18,errmes,2);
      wrtout(pFStack_18,"< End-of-File >");
      wrtout(pFStack_18," ");
    }
  }
  else {
    wrtserr(pFStack_18,"Bad HDU? ",(int *)((long)&headstart + 4),2);
  }
  return;
}

Assistant:

void  test_end(fitsfile *infits, 
		  FILE *out) 

{   
   int status = 0; 
   LONGLONG headstart, datastart, dataend;
   int hdutype;

   /* check whether there are any HDU left */ 
   fits_movrel_hdu(infits,1, &hdutype, &status);
   if (!status) {
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
    "There are extraneous HDU(s) beyond the end of last HDU.");
       wrterr(out,errmes,2);
       wrtout(out," ");
       return;
   }

   if (status != END_OF_FILE) { 
      wrtserr(out,"Bad HDU? ",&status,2);
      return;
   } 

   status = 0;  
   fits_clear_errmsg();
   if(ffghadll(infits, &headstart, &datastart, &dataend, &status)) 
       wrtferr(out, "",&status,1);

   /* try to move to the last byte of this extension.  */
   if (ffmbyt(infits, dataend - 1,0,&status))
   {
       sprintf(errmes, 
   "Error trying to read last byte of the file at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out,"< End-of-File >");
       wrtout(out," ");
       return;
   } 

   /* try to move to what would be the first byte of the next extension. 
     If successfull, we have a problem... */

   ffmbyt(infits, dataend,0,&status);
   if(status == 0) { 
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
     "File has extra byte(s) after last HDU at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out," ");
   } 

   return;
}